

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_hex33_version0_Test::ConfidentialValue_Constractor_hex33_version0_Test
          (ConfidentialValue_Constractor_hex33_version0_Test *this)

{
  ConfidentialValue_Constractor_hex33_version0_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialValue_Constractor_hex33_version0_Test_00675528;
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex33_version0) {
  // 33byte
  ConfidentialValue value(
      "00b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_STREQ(value.GetHex().c_str(), "");
  EXPECT_EQ(value.GetData().GetDataSize(), 0);
  EXPECT_EQ(value.HasBlinding(), false);
  int64_t satoshi = 0;
  EXPECT_NO_THROW((satoshi = value.GetAmount().GetSatoshiValue()));
  EXPECT_EQ(satoshi, 0);
}